

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusAnalyzerSettings.cpp
# Opt level: O2

void __thiscall SMBusAnalyzerSettings::LoadSettings(SMBusAnalyzerSettings *this,char *settings)

{
  bool calc_pec;
  SimpleArchive text_archive;
  int s;
  
  SimpleArchive::SimpleArchive(&text_archive);
  SimpleArchive::SetString((char *)&text_archive);
  SimpleArchive::operator>>(&text_archive,&this->mSMBDAT);
  SimpleArchive::operator>>(&text_archive,&this->mSMBCLK);
  SimpleArchive::operator>>(&text_archive,&s);
  this->mDecodeLevel = s;
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mSMBDAT,true);
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mSMBCLK,true);
  SimpleArchive::operator>>(&text_archive,&calc_pec);
  AnalyzerSettingInterfaceBool::SetValue((bool)((char)this + -0x80));
  UpdateInterfacesFromSettings(this);
  SimpleArchive::~SimpleArchive(&text_archive);
  return;
}

Assistant:

void SMBusAnalyzerSettings::LoadSettings( const char* settings )
{
    SimpleArchive text_archive;
    text_archive.SetString( settings );

    text_archive >> mSMBDAT;
    text_archive >> mSMBCLK;

    int s;
    text_archive >> s;
    mDecodeLevel = SMBusDecodeLevel( s );

    ClearChannels();

    AddChannel( mSMBDAT, "SMBDAT", true );
    AddChannel( mSMBCLK, "SMBCLK", true );

    bool calc_pec;
    text_archive >> calc_pec;
    mCalculatePECInterface.SetValue( calc_pec );

    UpdateInterfacesFromSettings();
}